

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.c
# Opt level: O3

void sprint(smat *m,char *caption,uint st,int ch,FILE *d)

{
  bool bVar1;
  undefined4 in_register_00000014;
  char *pcVar2;
  re_guts *g;
  FILE *in_R9;
  ulong uVar3;
  
  if (((uint)caption >> 8 & 1) == 0) {
    return;
  }
  fputs((char *)CONCAT44(in_register_00000014,st),in_R9);
  if ((int)d != 0) {
    pchar((int)d);
    fprintf(in_R9," %s",pchar::pbuf);
  }
  pcVar2 = m->coldp;
  if (0 < (long)pcVar2) {
    bVar1 = true;
    uVar3 = 0;
    do {
      if (((uint)ch >> ((uint)uVar3 & 0x1f) & 1) != 0) {
        pcVar2 = "\t";
        if (!bVar1) {
          pcVar2 = ", ";
        }
        bVar1 = false;
        fprintf(in_R9,"%s%d",pcVar2,uVar3 & 0xffffffff);
        pcVar2 = m->coldp;
      }
      uVar3 = uVar3 + 1;
    } while ((long)uVar3 < (long)pcVar2);
  }
  fputc(10,in_R9);
  return;
}

Assistant:

static void
print(m, caption, st, ch, d)
struct match *m;
char *caption;
states st;
int ch;
FILE *d;
{
	struct re_guts *g = m->g;
	int i;
	int first = 1;

	if (!(m->eflags&REG_TRACE))
		return;

	fprintf(d, "%s", caption);
	if (ch != '\0')
		fprintf(d, " %s", pchar(ch));
	for (i = 0; i < g->nstates; i++)
		if (ISSET(st, i)) {
			fprintf(d, "%s%d", (first) ? "\t" : ", ", i);
			first = 0;
		}
	fprintf(d, "\n");
}